

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotefile.c
# Opt level: O1

apx_size_t rmf_address_encode(uint8_t *buf,apx_size_t buf_size,uint32_t address,_Bool more_bit)

{
  apx_size_t aVar1;
  uint uVar2;
  uint uVar3;
  
  aVar1 = 0;
  if ((address < 0x40000000 && (buf_size != 0 && buf != (uint8_t *)0x0)) &&
     (uVar2 = (uint)(0x3fff < address) * 2 + 2, uVar2 <= buf_size)) {
    uVar3 = (more_bit | 0xfffffffe) << 0x1e;
    if (0x3fff >= address) {
      uVar3 = (uint)more_bit << 0xe;
    }
    packBE(buf,uVar3 | address,(0x3fff < address) * '\x02' + '\x02');
    aVar1 = uVar2;
  }
  return aVar1;
}

Assistant:

apx_size_t rmf_address_encode(uint8_t* buf, apx_size_t buf_size, uint32_t address, bool more_bit)
{
   if ((buf == NULL) || (buf_size == 0) || (address > RMF_HIGH_ADDR_MAX))
   {
      return 0; //Invalid argument
   }
   apx_size_t encoding_size = rmf_needed_encoding_size(address);
   if (encoding_size <= buf_size)
   {
      if (encoding_size == UINT16_SIZE)
      {
         uint16_t value = more_bit ? RMF_MORE_BIT_LOW_ADDR : 0u;
         value |= (uint16_t)address;
         packBE(buf, (uint32_t)value, (uint8_t) UINT16_SIZE);
      }
      else
      {
         assert(encoding_size == UINT32_SIZE);
         uint32_t value = more_bit ? (RMF_HIGH_ADDR_BIT | RMF_MORE_BIT_HIGH_ADDR) : RMF_HIGH_ADDR_BIT;
         value |= address;
         packBE(buf, value, (uint8_t)UINT32_SIZE);
      }
   }
   else
   {
      return 0u; //Not enough bytes in buffer
   }
   return encoding_size;
}